

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

_Bool av1_resize_and_extend_frame_nonnormative
                (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,int bd,int num_planes)

{
  uint length;
  uint length_00;
  int iVar1;
  int olength;
  int olength_00;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  uint uVar6;
  int iVar7;
  uint16_t *memblk;
  uint16_t *otmp;
  uint16_t *input;
  uint16_t *output;
  uint16_t *puVar8;
  long lVar9;
  uint16_t *puVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  
  bVar16 = num_planes < 1;
  if (0 < num_planes) {
    uVar15 = 3;
    if (num_planes < 3) {
      uVar15 = (ulong)(uint)num_planes;
    }
    uVar14 = 0;
    do {
      if ((src->flags & 8) == 0) {
        lVar13 = (ulong)(uVar14 != 0) * 4;
        _Var5 = av1_resize_plane(src->store_buf_adr[uVar14 - 4],
                                 *(int *)((long)src->store_buf_adr + lVar13 + -0x30),
                                 *(int *)((long)src->store_buf_adr + lVar13 + -0x38),
                                 *(int *)((long)src->store_buf_adr + lVar13 + -0x28),
                                 dst->store_buf_adr[uVar14 - 4],
                                 *(int *)((long)dst->store_buf_adr + lVar13 + -0x30),
                                 *(int *)((long)dst->store_buf_adr + lVar13 + -0x38),
                                 *(int *)((long)dst->store_buf_adr + lVar13 + -0x28));
        if (!_Var5) {
          if (bVar16 == false) {
            return false;
          }
          break;
        }
      }
      else {
        puVar3 = src->store_buf_adr[uVar14 - 4];
        lVar13 = (ulong)(uVar14 != 0) * 4;
        length = *(uint *)((long)src->store_buf_adr + lVar13 + -0x30);
        length_00 = *(uint *)((long)src->store_buf_adr + lVar13 + -0x38);
        iVar1 = *(int *)((long)src->store_buf_adr + lVar13 + -0x28);
        puVar4 = dst->store_buf_adr[uVar14 - 4];
        olength = *(int *)((long)dst->store_buf_adr + lVar13 + -0x30);
        olength_00 = *(int *)((long)dst->store_buf_adr + lVar13 + -0x38);
        lVar11 = (long)olength_00;
        iVar2 = *(int *)((long)dst->store_buf_adr + lVar13 + -0x28);
        memblk = (uint16_t *)aom_malloc((long)(int)length * 2 * lVar11);
        uVar6 = length;
        if ((int)length < (int)length_00) {
          uVar6 = length_00;
        }
        otmp = (uint16_t *)aom_malloc((long)(int)uVar6 * 2);
        input = (uint16_t *)aom_malloc((long)(int)length * 2);
        output = (uint16_t *)aom_malloc((long)olength * 2);
        auVar17._0_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
        auVar17._4_4_ = -(uint)((int)otmp == 0 && (int)((ulong)otmp >> 0x20) == 0);
        auVar17._8_4_ = -(uint)((int)((ulong)input >> 0x20) == 0 && (int)input == 0);
        auVar17._12_4_ = -(uint)((int)output == 0 && (int)((ulong)output >> 0x20) == 0);
        iVar7 = movmskps((int)output,auVar17);
        if (iVar7 == 0) {
          uVar12 = (ulong)length;
          if (0 < (int)length) {
            puVar10 = (uint16_t *)((long)puVar3 * 2);
            puVar8 = memblk;
            do {
              highbd_resize_multistep(puVar10,length_00,puVar8,olength_00,otmp,bd);
              puVar8 = puVar8 + lVar11;
              puVar10 = puVar10 + iVar1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          if (0 < olength_00) {
            lVar13 = 0;
            puVar10 = memblk;
            do {
              if (0 < (int)length) {
                lVar9 = 0;
                puVar8 = puVar10;
                do {
                  input[lVar9] = *puVar8;
                  lVar9 = lVar9 + 1;
                  puVar8 = puVar8 + lVar11;
                } while (length != (uint)lVar9);
              }
              highbd_resize_multistep(input,length,output,olength,otmp,bd);
              if (0 < olength) {
                puVar8 = (uint16_t *)((long)(puVar4 + lVar13) * 2);
                lVar9 = 0;
                do {
                  *puVar8 = output[lVar9];
                  lVar9 = lVar9 + 1;
                  puVar8 = puVar8 + iVar2;
                } while (olength != (int)lVar9);
              }
              lVar13 = lVar13 + 1;
              puVar10 = puVar10 + 1;
            } while (lVar13 != lVar11);
          }
        }
        aom_free(memblk);
        aom_free(otmp);
        aom_free(input);
        aom_free(output);
      }
      uVar14 = uVar14 + 1;
      bVar16 = uVar15 <= uVar14;
    } while (uVar14 != uVar15);
  }
  aom_extend_frame_borders_c(dst,num_planes);
  return bVar16;
}

Assistant:

bool av1_resize_and_extend_frame_nonnormative(const YV12_BUFFER_CONFIG *src,
                                              YV12_BUFFER_CONFIG *dst, int bd,
                                              int num_planes) {
  // TODO(dkovalev): replace YV12_BUFFER_CONFIG with aom_image_t

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
#if CONFIG_AV1_HIGHBITDEPTH
    if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
      highbd_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv], bd);
    } else if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                                 src->crop_widths[is_uv], src->strides[is_uv],
                                 dst->buffers[i], dst->crop_heights[is_uv],
                                 dst->crop_widths[is_uv],
                                 dst->strides[is_uv])) {
      return false;
    }
#else
    (void)bd;
    if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv]))
      return false;
#endif
  }
  aom_extend_frame_borders(dst, num_planes);
  return true;
}